

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O2

z_size_t cm_zlib_gzfread(voidp buf,z_size_t size,z_size_t nitems,gzFile file)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  z_size_t zVar4;
  
  if ((file != (gzFile)0x0) && (file[1].have == 0x1c4f)) {
    iVar1 = *(int *)((long)&file[4].pos + 4);
    if ((iVar1 == 0) || (iVar1 == -5)) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = size;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = nitems;
      zVar4 = SUB168(auVar2 * auVar3,0);
      if ((size == 0) || (SUB168(auVar2 * auVar3,8) == 0)) {
        if (zVar4 != 0) {
          zVar4 = gz_read((gz_statep)file,buf,zVar4);
          return zVar4 / size;
        }
      }
      else {
        cm_zlib_gz_error((gz_statep)file,-2,"request does not fit in a size_t");
      }
    }
    return 0;
  }
  return 0;
}

Assistant:

z_size_t ZEXPORT gzfread(buf, size, nitems, file)
    voidp buf;
    z_size_t size;
    z_size_t nitems;
    gzFile file;
{
    z_size_t len;
    gz_statep state;

    /* get internal structure */
    if (file == NULL)
        return 0;
    state = (gz_statep)file;

    /* check that we're reading and that there's no (serious) error */
    if (state->mode != GZ_READ ||
            (state->err != Z_OK && state->err != Z_BUF_ERROR))
        return 0;

    /* compute bytes to read -- error on overflow */
    len = nitems * size;
    if (size && len / size != nitems) {
        gz_error(state, Z_STREAM_ERROR, "request does not fit in a size_t");
        return 0;
    }

    /* read len or fewer bytes to buf, return the number of full items read */
    return len ? gz_read(state, buf, len) / size : 0;
}